

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O1

_Bool check_unconditional_trap(DisasContext_conflict10 *ctx)

{
  uint uVar1;
  _Bool _Var2;
  
  _Var2 = true;
  uVar1 = ctx->opcode >> 0x15 & 0x1f;
  if (uVar1 != 0) {
    if (uVar1 == 0x1f) {
      gen_exception_err(ctx,6,0x40);
    }
    else {
      _Var2 = false;
    }
  }
  return _Var2;
}

Assistant:

static bool check_unconditional_trap(DisasContext *ctx)
{
    /* Trap never */
    if (TO(ctx->opcode) == 0) {
        return true;
    }
    /* Trap always */
    if (TO(ctx->opcode) == 31) {
        gen_exception_err(ctx, POWERPC_EXCP_PROGRAM, POWERPC_EXCP_TRAP);
        return true;
    }
    return false;
}